

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Mesh *pMVar8;
  size_type sVar9;
  reference ppSVar10;
  DeadlyImportError *pDVar11;
  Buffer *this_00;
  ulong uVar12;
  aiMesh *paVar13;
  uint *puVar14;
  reference pvVar15;
  aiVector3D *paVar16;
  Accessor *pAVar17;
  ulong *puVar18;
  Ref<glTF::Buffer> RVar19;
  aiFace *local_598;
  aiFace *local_568;
  aiFace *local_538;
  aiFace *local_508;
  aiFace *local_4d8;
  aiFace *local_4a8;
  aiFace *local_440;
  aiFace *local_3e0;
  aiFace *local_398;
  aiFace *local_340;
  aiFace *local_2f8;
  aiFace *local_2b8;
  uint local_1c4;
  uint local_1c0;
  uint i_12;
  uint i_11;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint count_1;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  Indexer data;
  uint count;
  uint nFaces;
  aiFace *faces;
  uint i;
  aiVector3D *values;
  size_t tc;
  Attributes *attr;
  ai_uint32 *len;
  aiMesh *aim;
  Primitive *prim;
  uint p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *local_c0;
  uint local_b8;
  undefined1 local_b0 [8];
  Ref<glTF::Buffer> buf;
  SCompression_Open3DGC *o3dgc_ext;
  string local_90;
  SExtension *local_70;
  SExtension *cur_ext;
  iterator __end3;
  iterator __begin3;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *__range3;
  Mesh *mesh;
  uint local_38;
  value_type_conflict4 local_34;
  uint m;
  uint k;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  Asset *r_local;
  glTFImporter *this_local;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)r;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m);
  local_34 = 0;
  local_38 = 0;
  do {
    uVar5 = glTF::LazyDict<glTF::Mesh>::Size
                      ((LazyDict<glTF::Mesh> *)
                       (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x8b));
    if (uVar5 <= local_38) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->meshOffsets,&local_34);
      BaseImporter::CopyVector<aiMesh*>
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m,&this->mScene->mMeshes,
                 &this->mScene->mNumMeshes);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m);
      return;
    }
    pMVar8 = glTF::LazyDict<glTF::Mesh>::operator[]
                       ((LazyDict<glTF::Mesh> *)
                        (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x8b),(ulong)local_38);
    sVar9 = std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
            ::size(&pMVar8->Extension);
    if (sVar9 != 0) {
      __end3 = std::__cxx11::
               list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::begin
                         (&pMVar8->Extension);
      cur_ext = (SExtension *)
                std::__cxx11::
                list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::end
                          (&pMVar8->Extension);
      while (bVar4 = std::operator!=(&__end3,(_Self *)&cur_ext), bVar4) {
        ppSVar10 = std::_List_iterator<glTF::Mesh::SExtension_*>::operator*(&__end3);
        local_70 = *ppSVar10;
        if (local_70->Type != Compression_Open3DGC) {
          prim._7_1_ = 1;
          pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          to_string<glTF::Mesh::SExtension::EType>((string *)&p,local_70->Type);
          std::operator+(&local_100,"GLTF: Can not import mesh: unknown mesh extension (code: \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
          std::operator+(&local_e0,&local_100,"\"), only Open3DGC is supported.");
          DeadlyImportError::DeadlyImportError(pDVar11,&local_e0);
          prim._7_1_ = 0;
          __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        sVar9 = std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::size
                          (&pMVar8->primitives);
        if (2 < sVar9) {
          o3dgc_ext._6_1_ = 1;
          pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_90,
                     "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                     ,(allocator *)((long)&o3dgc_ext + 7));
          DeadlyImportError::DeadlyImportError(pDVar11,&local_90);
          o3dgc_ext._6_1_ = 0;
          __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        buf._8_8_ = local_70;
        RVar19 = glTF::LazyDict<glTF::Buffer>::Get
                           ((LazyDict<glTF::Buffer> *)
                            (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0x45),
                            (string *)(local_70 + 1));
        local_c0 = RVar19.vector;
        local_b8 = RVar19.index;
        local_b0 = (undefined1  [8])local_c0;
        buf.vector._0_4_ = local_b8;
        this_00 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_b0);
        glTF::Buffer::EncodedRegion_SetCurrent(this_00,&(pMVar8->super_Object).id);
        std::_List_iterator<glTF::Mesh::SExtension_*>::operator++(&__end3);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->meshOffsets,&local_34);
    sVar9 = std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::size
                      (&pMVar8->primitives);
    local_34 = (int)sVar9 + local_34;
    for (prim._0_4_ = 0; uVar12 = (ulong)(uint)prim,
        sVar9 = std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::size
                          (&pMVar8->primitives), uVar12 < sVar9; prim._0_4_ = (uint)prim + 1) {
      aim = (aiMesh *)
            std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::operator[]
                      (&pMVar8->primitives,(ulong)(uint)prim);
      paVar13 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar13);
      len = (ai_uint32 *)paVar13;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m,(value_type *)&len);
      aiString::operator=((aiString *)(len + 0x3b),&(pMVar8->super_Object).id);
      sVar9 = std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::size
                        (&pMVar8->primitives);
      if (1 < sVar9) {
        puVar14 = len + 0x3b;
        *(undefined1 *)((long)len + (ulong)*puVar14 + 0xf0) = 0x2d;
        uVar5 = ASSIMP_itoa10((char *)((long)len + (ulong)*puVar14 + 0xf1),0x3ff - *puVar14,
                              (uint)prim);
        *puVar14 = uVar5 + 1 + *puVar14;
      }
      paVar13 = aim;
      uVar5 = aim->mPrimitiveTypes;
      if (uVar5 == 0) {
        *len = *len | 1;
      }
      else if (uVar5 - 1 < 3) {
        *len = *len | 2;
      }
      else if (uVar5 - 4 < 3) {
        *len = *len | 4;
      }
      puVar14 = &aim->mNumFaces;
      sVar9 = std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
              size((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_> *
                   )puVar14);
      if (sVar9 != 0) {
        pvVar15 = std::
                  vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                  operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                              *)puVar14,0);
        bVar4 = glTF::Ref::operator_cast_to_bool((Ref *)pvVar15);
        if (bVar4) {
          pvVar15 = std::
                    vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                    operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                *)puVar14,0);
          pAVar17 = glTF::Ref<glTF::Accessor>::operator->(pvVar15);
          len[1] = pAVar17->count;
          pvVar15 = std::
                    vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                    operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                *)puVar14,0);
          pAVar17 = glTF::Ref<glTF::Accessor>::operator->(pvVar15);
          glTF::Accessor::ExtractData<aiVector3t<float>>(pAVar17,(aiVector3t<float> **)(len + 4));
        }
      }
      sVar9 = std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
              size((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_> *
                   )&paVar13->mTangents);
      if (sVar9 != 0) {
        pvVar15 = std::
                  vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                  operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                              *)&paVar13->mTangents,0);
        bVar4 = glTF::Ref::operator_cast_to_bool((Ref *)pvVar15);
        if (bVar4) {
          pvVar15 = std::
                    vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                    operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                *)&paVar13->mTangents,0);
          pAVar17 = glTF::Ref<glTF::Accessor>::operator->(pvVar15);
          glTF::Accessor::ExtractData<aiVector3t<float>>(pAVar17,(aiVector3t<float> **)(len + 6));
        }
      }
      for (values = (aiVector3D *)0x0;
          paVar16 = (aiVector3D *)
                    std::
                    vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                    size((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                          *)(paVar13->mColors + 1)), values < paVar16 && values < (aiVector3D *)0x8;
          values = (aiVector3D *)((long)&values->x + 1)) {
        pvVar15 = std::
                  vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                  operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                              *)(paVar13->mColors + 1),(size_type)values);
        pAVar17 = glTF::Ref<glTF::Accessor>::operator->(pvVar15);
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (pAVar17,(aiVector3t<float> **)(len + (long)values * 2 + 0x1c));
        pvVar15 = std::
                  vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
                  operator[]((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                              *)(paVar13->mColors + 1),(size_type)values);
        pAVar17 = glTF::Ref<glTF::Accessor>::operator->(pvVar15);
        uVar5 = glTF::Accessor::GetNumComponents(pAVar17);
        len[(long)&values[3].z] = uVar5;
        lVar3 = *(long *)(len + (long)values * 2 + 0x1c);
        for (faces._4_4_ = 0; faces._4_4_ < len[1]; faces._4_4_ = faces._4_4_ + 1) {
          *(float *)(lVar3 + (ulong)faces._4_4_ * 0xc + 4) =
               1.0 - *(float *)(lVar3 + (ulong)faces._4_4_ * 0xc + 4);
        }
      }
      _count = (aiFace *)0x0;
      data.stride._4_4_ = 0;
      bVar4 = glTF::Ref::operator_cast_to_bool((Ref *)aim->mNumUVComponents);
      if (bVar4) {
        pAVar17 = glTF::Ref<glTF::Accessor>::operator->
                            ((Ref<glTF::Accessor> *)aim->mNumUVComponents);
        data.stride._0_4_ = pAVar17->count;
        pAVar17 = glTF::Ref<glTF::Accessor>::operator->
                            ((Ref<glTF::Accessor> *)aim->mNumUVComponents);
        glTF::Accessor::GetIndexer((Indexer *)&i_2,pAVar17);
        bVar4 = glTF::Accessor::Indexer::IsValid((Indexer *)&i_2);
        if (!bVar4) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                        ,0x13f,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
        }
        switch(aim->mPrimitiveTypes) {
        case 0:
          data.stride._4_4_ = (uint)data.stride;
          uVar12 = (ulong)(uint)data.stride;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_2b8 = _count;
            do {
              aiFace::aiFace(local_2b8);
              local_2b8 = local_2b8 + 1;
            } while (local_2b8 != _count + uVar12);
          }
          for (i_3 = 0; i_3 < (uint)data.stride; i_3 = i_3 + 1) {
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_3);
            SetFace(_count + i_3,uVar5);
          }
          break;
        case 1:
          data.stride._4_4_ = (uint)data.stride >> 1;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_2f8 = _count;
            do {
              aiFace::aiFace(local_2f8);
              local_2f8 = local_2f8 + 1;
            } while (local_2f8 != _count + uVar12);
          }
          for (i_4 = 0; i_4 < (uint)data.stride; i_4 = i_4 + 2) {
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_4);
            uVar6 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_4 + 1);
            SetFace(_count + (i_4 >> 1),uVar5,uVar6);
          }
          break;
        case 2:
        case 3:
          data.stride._4_4_ = (uint)data.stride - (aim->mPrimitiveTypes == 3);
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_340 = _count;
            do {
              aiFace::aiFace(local_340);
              local_340 = local_340 + 1;
            } while (local_340 != _count + uVar12);
          }
          uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,0);
          uVar6 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,1);
          SetFace(_count,uVar5,uVar6);
          for (i_5 = 2; i_5 < (uint)data.stride; i_5 = i_5 + 1) {
            iVar1 = *(int *)(puVar18[(ulong)(i_5 - 2) * 2 + 2] + 4);
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_5);
            SetFace(_count + (i_5 - 1),iVar1,uVar5);
          }
          if (aim->mPrimitiveTypes == 2) {
            SetFace(_count + ((uint)data.stride - 1),
                    *(int *)(puVar18[(ulong)((uint)data.stride - 2) * 2 + 2] + 4),*(int *)puVar18[2]
                   );
          }
          break;
        case 4:
          data.stride._4_4_ = (uint)data.stride / 3;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_398 = _count;
            do {
              aiFace::aiFace(local_398);
              local_398 = local_398 + 1;
            } while (local_398 != _count + uVar12);
          }
          for (i_6 = 0; i_6 < (uint)data.stride; i_6 = i_6 + 3) {
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_6);
            uVar6 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_6 + 1);
            uVar7 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_6 + 2);
            SetFace((aiFace *)
                    ((long)&_count->mNumIndices +
                    ((ulong)i_6 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0)),uVar5,uVar6,uVar7);
          }
          break;
        case 5:
          data.stride._4_4_ = (uint)data.stride - 2;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_3e0 = _count;
            do {
              aiFace::aiFace(local_3e0);
              local_3e0 = local_3e0 + 1;
            } while (local_3e0 != _count + uVar12);
          }
          uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,0);
          uVar6 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,1);
          uVar7 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,2);
          SetFace(_count,uVar5,uVar6,uVar7);
          for (count_1 = 3; count_1 < (uint)data.stride; count_1 = count_1 + 1) {
            iVar1 = *(int *)(puVar18[(ulong)(count_1 - 1) * 2 + 2] + 4);
            iVar2 = *(int *)(puVar18[(ulong)(count_1 - 1) * 2 + 2] + 8);
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,count_1);
            SetFace(_count + (count_1 - 2),iVar1,iVar2,uVar5);
          }
          break;
        case 6:
          data.stride._4_4_ = (uint)data.stride - 2;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_440 = _count;
            do {
              aiFace::aiFace(local_440);
              local_440 = local_440 + 1;
            } while (local_440 != _count + uVar12);
          }
          uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,0);
          uVar6 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,1);
          uVar7 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,2);
          SetFace(_count,uVar5,uVar6,uVar7);
          for (i_7 = 3; i_7 < (uint)data.stride; i_7 = i_7 + 1) {
            iVar1 = *(int *)puVar18[2];
            iVar2 = *(int *)(puVar18[(ulong)(i_7 - 1) * 2 + 2] + 8);
            uVar5 = glTF::Accessor::Indexer::GetUInt((Indexer *)&i_2,i_7);
            SetFace(_count + (i_7 - 2),iVar1,iVar2,uVar5);
          }
        }
      }
      else {
        uVar5 = len[1];
        switch(aim->mPrimitiveTypes) {
        case 0:
          uVar12 = (ulong)uVar5;
          data.stride._4_4_ = uVar5;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_4a8 = _count;
            do {
              aiFace::aiFace(local_4a8);
              local_4a8 = local_4a8 + 1;
            } while (local_4a8 != _count + uVar12);
          }
          for (i_9 = 0; i_9 < uVar5; i_9 = i_9 + 1) {
            SetFace(_count + i_9,i_9);
          }
          break;
        case 1:
          data.stride._4_4_ = uVar5 >> 1;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_4d8 = _count;
            do {
              aiFace::aiFace(local_4d8);
              local_4d8 = local_4d8 + 1;
            } while (local_4d8 != _count + uVar12);
          }
          for (i_10 = 0; i_10 < uVar5; i_10 = i_10 + 2) {
            SetFace(_count + (i_10 >> 1),i_10,i_10 + 1);
          }
          break;
        case 2:
        case 3:
          data.stride._4_4_ = uVar5 - (aim->mPrimitiveTypes == 3);
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_508 = _count;
            do {
              aiFace::aiFace(local_508);
              local_508 = local_508 + 1;
            } while (local_508 != _count + uVar12);
          }
          SetFace(_count,0,1);
          for (i_11 = 2; i_11 < uVar5; i_11 = i_11 + 1) {
            SetFace(_count + (i_11 - 1),*(int *)(puVar18[(ulong)(i_11 - 2) * 2 + 2] + 4),i_11);
          }
          if (aim->mPrimitiveTypes == 2) {
            SetFace(_count + (uVar5 - 1),*(int *)(puVar18[(ulong)(uVar5 - 2) * 2 + 2] + 4),
                    *(int *)puVar18[2]);
          }
          break;
        case 4:
          data.stride._4_4_ = uVar5 / 3;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_538 = _count;
            do {
              aiFace::aiFace(local_538);
              local_538 = local_538 + 1;
            } while (local_538 != _count + uVar12);
          }
          for (i_12 = 0; i_12 < uVar5; i_12 = i_12 + 3) {
            SetFace((aiFace *)
                    ((long)&_count->mNumIndices +
                    ((ulong)i_12 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0)),i_12,i_12 + 1,i_12 + 2)
            ;
          }
          break;
        case 5:
          data.stride._4_4_ = uVar5 - 2;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_568 = _count;
            do {
              aiFace::aiFace(local_568);
              local_568 = local_568 + 1;
            } while (local_568 != _count + uVar12);
          }
          SetFace(_count,0,1,2);
          for (local_1c0 = 3; local_1c0 < uVar5; local_1c0 = local_1c0 + 1) {
            SetFace(_count + (local_1c0 - 2),*(int *)(puVar18[(ulong)(local_1c0 - 1) * 2 + 2] + 4),
                    *(int *)(puVar18[(ulong)(local_1c0 - 1) * 2 + 2] + 8),local_1c0);
          }
          break;
        case 6:
          data.stride._4_4_ = uVar5 - 2;
          uVar12 = (ulong)data.stride._4_4_;
          puVar18 = (ulong *)operator_new__(uVar12 << 4 | 8);
          *puVar18 = uVar12;
          _count = (aiFace *)(puVar18 + 1);
          if (uVar12 != 0) {
            local_598 = _count;
            do {
              aiFace::aiFace(local_598);
              local_598 = local_598 + 1;
            } while (local_598 != _count + uVar12);
          }
          SetFace(_count,0,1,2);
          for (local_1c4 = 3; local_1c4 < uVar5; local_1c4 = local_1c4 + 1) {
            SetFace(_count + (local_1c4 - 2),*(int *)puVar18[2],
                    *(int *)(puVar18[(ulong)(local_1c4 - 1) * 2 + 2] + 8),local_1c4);
          }
        }
      }
      if (_count != (aiFace *)0x0) {
        *(aiFace **)(len + 0x34) = _count;
        len[2] = data.stride._4_4_;
        bVar4 = CheckValidFacesIndices(_count,data.stride._4_4_,len[1]);
        if (!bVar4) {
          __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                        ,0x1c2,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
        }
      }
      bVar4 = glTF::Ref::operator_cast_to_bool((Ref *)(aim->mNumUVComponents + 4));
      if (bVar4) {
        uVar5 = glTF::Ref<glTF::Material>::GetIndex
                          ((Ref<glTF::Material> *)(aim->mNumUVComponents + 4));
        len[0x3a] = uVar5;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}